

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

int __thiscall ncnn::Net::load_param_bin(Net *this,DataReader *dr)

{
  vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  pointer plVar1;
  layer_creator_func p_Var2;
  pointer pBVar3;
  iterator __position;
  int *piVar4;
  void *__ptr;
  long *plVar5;
  bool bVar6;
  Net *pNVar7;
  int iVar8;
  Layer *pLVar9;
  ulong uVar10;
  long lVar11;
  int bottom_blob_index;
  int top_count;
  int bottom_count;
  int typeindex;
  int blob_count;
  int layer_count;
  int magic;
  ParamDict pd;
  bool local_96d;
  int local_96c;
  int local_968;
  int local_964;
  int local_960;
  uint local_95c;
  int local_958;
  int local_954;
  Layer *local_950;
  Net *local_948;
  int local_93c;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_938;
  ParamDict local_930;
  
  local_93c = 0;
  local_948 = this;
  iVar8 = (*dr->_vptr_DataReader[3])(dr,&local_93c,4);
  if (iVar8 == 4) {
    if (local_93c == 0x7685dd) {
      local_954 = 0;
      local_958 = 0;
      iVar8 = (*dr->_vptr_DataReader[3])(dr,&local_954,4);
      if (iVar8 == 4) {
        iVar8 = (*dr->_vptr_DataReader[3])(dr,&local_958,4);
        pNVar7 = local_948;
        if (iVar8 == 4) {
          if ((0 < (long)local_954) && (0 < local_958)) {
            local_938 = &local_948->layers;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
                      (local_938,(long)local_954);
            this_00 = &pNVar7->blobs;
            std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::resize(this_00,(long)local_958);
            ParamDict::ParamDict(&local_930);
            local_96c = 0;
            local_96d = 0 < local_954;
            if (0 < local_954) {
              do {
                iVar8 = (*dr->_vptr_DataReader[3])(dr,&local_95c,4);
                if (iVar8 == 4) {
                  iVar8 = (*dr->_vptr_DataReader[3])(dr,&local_960,4);
                  if (iVar8 != 4) {
                    load_param_bin();
                    goto LAB_00120f7c;
                  }
                  iVar8 = (*dr->_vptr_DataReader[3])(dr,&local_964,4);
                  if (iVar8 != 4) {
                    load_param_bin();
                    goto LAB_00120f7c;
                  }
                  pLVar9 = create_layer(local_95c);
                  if (pLVar9 == (Layer *)0x0) {
                    if ((int)local_95c < 0) {
LAB_00120dbd:
                      pLVar9 = (Layer *)0x0;
                    }
                    else {
                      plVar1 = (local_948->custom_layer_registry).
                               super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                      pLVar9 = (Layer *)0x0;
                      if ((int)(local_95c & 0xfffffeff) <
                          (int)((ulong)((long)(local_948->custom_layer_registry).
                                              super__Vector_base<ncnn::layer_registry_entry,_std::allocator<ncnn::layer_registry_entry>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)plVar1) >> 4)) {
                        p_Var2 = plVar1[local_95c & 0xfffffeff].creator;
                        if (p_Var2 == (layer_creator_func)0x0) goto LAB_00120dbd;
                        pLVar9 = (*p_Var2)();
                      }
                    }
                  }
                  if (pLVar9 == (Layer *)0x0) {
                    fprintf(_stderr,"layer %d not exists or registered\n",(ulong)local_95c);
                    uVar10 = 1;
                    clear(local_948);
                  }
                  else {
                    std::vector<int,_std::allocator<int>_>::resize(&pLVar9->bottoms,(long)local_960)
                    ;
                    bVar6 = 0 < local_960;
                    uVar10 = 5;
                    local_950 = pLVar9;
                    if (0 < local_960) {
                      lVar11 = 0;
                      do {
                        iVar8 = (*dr->_vptr_DataReader[3])(dr,&local_968,4);
                        if (iVar8 == 4) {
                          pBVar3 = (this_00->
                                   super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                                   _M_impl.super__Vector_impl_data._M_start;
                          __position._M_current =
                               pBVar3[local_968].consumers.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish;
                          if (__position._M_current ==
                              pBVar3[local_968].consumers.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage) {
                            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                                      ((vector<int,std::allocator<int>> *)
                                       &pBVar3[local_968].consumers,__position,&local_96c);
                          }
                          else {
                            *__position._M_current = local_96c;
                            pBVar3[local_968].consumers.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish = __position._M_current + 1;
                          }
                          (pLVar9->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar11] = local_968;
                        }
                        else {
                          load_param_bin();
                        }
                        if (iVar8 != 4) {
                          uVar10 = 1;
                          goto LAB_00120e89;
                        }
                        lVar11 = lVar11 + 1;
                        bVar6 = lVar11 < local_960;
                      } while (lVar11 < local_960);
                      uVar10 = 5;
                    }
LAB_00120e89:
                    pLVar9 = local_950;
                    if (!bVar6) {
                      this_01 = &local_950->tops;
                      std::vector<int,_std::allocator<int>_>::resize(this_01,(long)local_964);
                      bVar6 = 0 < local_964;
                      uVar10 = 8;
                      if (0 < local_964) {
                        lVar11 = 0;
                        do {
                          iVar8 = (*dr->_vptr_DataReader[3])(dr,&local_968,4);
                          if (iVar8 != 4) {
                            load_param_bin();
                            uVar10 = 1;
                            pLVar9 = local_950;
                            goto LAB_00120f26;
                          }
                          (this_00->super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>).
                          _M_impl.super__Vector_impl_data._M_start[local_968].producer = local_96c;
                          (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar11] = local_968;
                          lVar11 = lVar11 + 1;
                          bVar6 = lVar11 < local_964;
                        } while (lVar11 < local_964);
                        uVar10 = 8;
                        pLVar9 = local_950;
                      }
LAB_00120f26:
                      if (!bVar6) {
                        iVar8 = ParamDict::load_param_bin(&local_930,dr);
                        if (iVar8 == 0) {
                          iVar8 = (*pLVar9->_vptr_Layer[2])(pLVar9,&local_930);
                          if (iVar8 == 0) {
                            (local_938->
                            super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                            _M_impl.super__Vector_impl_data._M_start[local_96c] = pLVar9;
                            uVar10 = 0;
                            goto LAB_00120fc1;
                          }
                          load_param_bin();
                        }
                        else {
                          load_param_bin();
                        }
                        uVar10 = 0;
                      }
                    }
                  }
                }
                else {
                  load_param_bin();
LAB_00120f7c:
                  uVar10 = 1;
                }
LAB_00120fc1:
                if ((uVar10 & 0xb) != 0) break;
                local_96c = local_96c + 1;
                local_96d = local_96c < local_954;
              } while (local_96c < local_954);
            }
            lVar11 = 0x8c0;
            do {
              piVar4 = *(int **)((long)&local_930.params[0].v.data + lVar11);
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  __ptr = *(void **)((long)&local_930.params[0].type + lVar11);
                  plVar5 = *(long **)((long)&local_930.params[0].v.elempack + lVar11);
                  if (plVar5 == (long *)0x0) {
                    if (__ptr != (void *)0x0) {
                      free(__ptr);
                    }
                  }
                  else {
                    (**(code **)(*plVar5 + 0x18))();
                  }
                }
              }
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar11 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.refcount + lVar11 + 4) = 0;
              *(undefined8 *)((long)&local_930.params[0].type + lVar11) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.data + lVar11) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.allocator + lVar11) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.dims + lVar11) = 0;
              *(undefined8 *)((long)&local_930.params[0].v.h + lVar11) = 0;
              lVar11 = lVar11 + -0x48;
            } while (lVar11 != -0x40);
            return -(uint)local_96d;
          }
          load_param_bin();
        }
        else {
          load_param_bin();
        }
      }
      else {
        load_param_bin();
      }
    }
    else {
      load_param_bin();
    }
  }
  else {
    load_param_bin();
  }
  return -1;
}

Assistant:

int Net::load_param_bin(const DataReader& dr)
{
#define READ_VALUE(buf) \
    if (dr.read(&buf, sizeof(buf)) != sizeof(buf)) \
    { \
        fprintf(stderr, "read " #buf " failed\n"); \
        return -1; \
    }

    int magic = 0;
    READ_VALUE(magic)
    if (magic != 7767517)
    {
        fprintf(stderr, "param is too old, please regenerate\n");
        return -1;
    }

    int layer_count = 0;
    int blob_count = 0;
    READ_VALUE(layer_count)
    READ_VALUE(blob_count)
    if (layer_count <= 0 || blob_count <= 0)
    {
        fprintf(stderr, "invalid layer_count or blob_count\n");
        return -1;
    }

    layers.resize(layer_count);
    blobs.resize(blob_count);

#if NCNN_VULKAN
    if (opt.use_vulkan_compute)
    {
        if (!vkdev) vkdev = get_gpu_device();
        if (!vkdev) opt.use_vulkan_compute = false;// no vulkan device, fallback to cpu
    }
    if (opt.use_vulkan_compute)
    {
        // sanitize use options
        if (!vkdev->info.support_fp16_packed) opt.use_fp16_packed = false;
        if (!vkdev->info.support_fp16_storage) opt.use_fp16_storage = false;
        if (!vkdev->info.support_fp16_arithmetic) opt.use_fp16_arithmetic = false;
        if (!vkdev->info.support_int8_storage) opt.use_int8_storage = false;
        if (!vkdev->info.support_int8_arithmetic) opt.use_int8_arithmetic = false;
    }
#endif // NCNN_VULKAN

    ParamDict pd;

    for (int i=0; i<layer_count; i++)
    {
        int typeindex;
        int bottom_count;
        int top_count;
        READ_VALUE(typeindex)
        READ_VALUE(bottom_count)
        READ_VALUE(top_count)

        Layer* layer = create_layer(typeindex);
        if (!layer)
        {
            int custom_index = typeindex & ~LayerType::CustomBit;
            layer = create_custom_layer(custom_index);
        }
        if (!layer)
        {
            fprintf(stderr, "layer %d not exists or registered\n", typeindex);
            clear();
            return -1;
        }

#if NCNN_VULKAN
        if (opt.use_vulkan_compute)
            layer->vkdev = vkdev;
#endif // NCNN_VULKAN

//         layer->type = std::string(layer_type);
//         layer->name = std::string(layer_name);
//         fprintf(stderr, "new layer %d\n", typeindex);

        layer->bottoms.resize(bottom_count);
        for (int j=0; j<bottom_count; j++)
        {
            int bottom_blob_index;
            READ_VALUE(bottom_blob_index)

            Blob& blob = blobs[bottom_blob_index];

            blob.consumers.push_back(i);

            layer->bottoms[j] = bottom_blob_index;
        }

        layer->tops.resize(top_count);
        for (int j=0; j<top_count; j++)
        {
            int top_blob_index;
            READ_VALUE(top_blob_index)

            Blob& blob = blobs[top_blob_index];

//             blob.name = std::string(blob_name);
//             fprintf(stderr, "new blob %s\n", blob_name);

            blob.producer = i;

            layer->tops[j] = top_blob_index;
        }

        // layer specific params
        int pdlr = pd.load_param_bin(dr);
        if (pdlr != 0)
        {
            fprintf(stderr, "ParamDict load_param failed\n");
            continue;
        }

        int lr = layer->load_param(pd);
        if (lr != 0)
        {
            fprintf(stderr, "layer load_param failed\n");
            continue;
        }

        layers[i] = layer;
    }

#undef READ_VALUE
    return 0;
}